

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O0

void setWTConv(wt_object wt,char *cmethod)

{
  int iVar1;
  char *cmethod_local;
  wt_object wt_local;
  
  iVar1 = strcmp(cmethod,"fft");
  if ((iVar1 != 0) && (iVar1 = strcmp(cmethod,"FFT"), iVar1 != 0)) {
    iVar1 = strcmp(cmethod,"direct");
    if (iVar1 == 0) {
      strcpy(wt->cmethod,"direct");
      return;
    }
    printf("Convolution Only accepts two methods - direct and fft");
    exit(-1);
  }
  strcpy(wt->cmethod,"fft");
  return;
}

Assistant:

void setWTConv(wt_object wt, const char *cmethod) {
	if (!strcmp(cmethod, "fft") || !strcmp(cmethod, "FFT")) {
		strcpy(wt->cmethod, "fft");
	}
	else if (!strcmp(cmethod, "direct")) {
		strcpy(wt->cmethod, "direct");
	}
	else {
		printf("Convolution Only accepts two methods - direct and fft");
		exit(-1);
	}
}